

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
VersionEqualNode::Evaluate
          (string *__return_storage_ptr__,VersionEqualNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_9;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = cmSystemTools::VersionCompare
                    (OP_EQUAL,(pbVar1->_M_dataplus)._M_p,pbVar1[1]._M_dataplus._M_p);
  pcVar3 = "0";
  if (bVar2) {
    pcVar3 = "1";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* /*context*/,
                       const GeneratorExpressionContent* /*content*/,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    return cmSystemTools::VersionCompare(cmSystemTools::OP_EQUAL,
                                         parameters.front().c_str(),
                                         parameters[1].c_str())
      ? "1"
      : "0";
  }